

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinGlPointCoordCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinGlPointCoordCaseInstance *this)

{
  int iVar1;
  VkPhysicalDeviceProperties *pVVar2;
  ulong extraout_RAX;
  ulong uVar3;
  TestError *this_00;
  uint uVar4;
  int iVar5;
  uint uVar6;
  pointer pVVar7;
  int iVar8;
  uint uVar9;
  int dy;
  int iVar10;
  int iVar11;
  bool bVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  RGBA local_15c;
  PixelBufferAccess local_158;
  uint local_128 [2];
  undefined8 uStack_120;
  undefined1 local_118 [16];
  Surface refImage;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> coords;
  Surface resImage;
  UVec2 viewportSize;
  Random rnd;
  ConstPixelBufferAccess local_58;
  
  ShaderRenderCaseInstance::getViewportSize(&this->super_ShaderRenderCaseInstance);
  local_128 = viewportSize.m_data;
  uStack_120 = 0;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&coords,0x10,(allocator_type *)&local_158);
  deRandom_init(&rnd.m_rnd,0x145fa);
  uVar13 = local_128[0];
  uVar4 = local_128[1];
  tcu::Surface::Surface(&resImage,local_128[0],local_128[1]);
  tcu::Surface::Surface(&refImage,uVar13,uVar4);
  pVVar2 = Context::getDeviceProperties
                     ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
  local_118._0_4_ = (pVVar2->limits).pointSizeRange[0];
  fVar15 = (pVVar2->limits).pointSizeRange[1];
  fVar14 = ceilf((fVar15 - (float)local_118._0_4_) / (pVVar2->limits).pointSizeGranularity);
  iVar5 = 1;
  if (1 < (int)fVar14) {
    iVar5 = (int)fVar14;
  }
  if (fVar15 < (float)local_118._0_4_) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"minPointSize <= maxPointSize",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderBuiltinVarTests.cpp"
               ,0x212);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  for (pVVar7 = coords.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pVVar7 != coords.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_finish; pVVar7 = pVVar7 + 1) {
    fVar14 = deRandom_getFloat(&rnd.m_rnd);
    pVVar7->m_data[0] = fVar14 * 1.8 + -0.9;
    fVar14 = deRandom_getFloat(&rnd.m_rnd);
    pVVar7->m_data[1] = fVar14 * 1.8 + -0.9;
    iVar1 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar5);
    fVar14 = (float)iVar1 * (pVVar2->limits).pointSizeGranularity + (float)local_118._0_4_;
    uVar13 = -(uint)(fVar15 <= fVar14);
    pVVar7->m_data[2] = (float)(uVar13 & (uint)fVar15 | ~uVar13 & (uint)fVar14);
  }
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])(this);
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32_SFLOAT,0xc,0x10,
             coords.
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  local_158.super_ConstPixelBufferAccess.m_format.order = 0x3e000000;
  local_158.super_ConstPixelBufferAccess.m_format.type = 0x3e800000;
  local_158.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f000000;
  local_158.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
  ShaderRenderCaseInstance::render
            (&this->super_ShaderRenderCaseInstance,0x10,0,(deUint16 *)0x0,
             VK_PRIMITIVE_TOPOLOGY_POINT_LIST,(Vec4 *)&local_158);
  tcu::Surface::getAccess(&local_158,&resImage);
  tcu::TextureLevel::getAccess(&local_58,&(this->super_ShaderRenderCaseInstance).m_resultImage);
  tcu::copy((EVP_PKEY_CTX *)&local_158,(EVP_PKEY_CTX *)&local_58);
  tcu::Surface::getAccess(&local_158,&refImage);
  tcu::clear(&local_158,&(this->super_ShaderRenderCaseInstance).m_clearColor);
  fVar15 = (float)(int)local_128[0];
  fVar14 = (float)(int)local_128[1];
  fVar18 = (float)(int)uStack_120;
  fVar20 = (float)uStack_120._4_4_;
  uVar3 = extraout_RAX;
  for (; fVar27 = -0.5,
      coords.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      coords.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish;
      coords.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           coords.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    fVar21 = (coords.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->m_data[2];
    local_128[0] = (uint)(((float)*(undefined8 *)
                                   (coords.
                                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data * 0.5 + 0.5)
                         * fVar15);
    fVar26 = ((float)((ulong)*(undefined8 *)
                              (coords.
                               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data >> 0x20) * 0.5 +
             0.5) * fVar14;
    local_128[1] = (uint)fVar26;
    uStack_120 = CONCAT44(fVar20 * 0.0,fVar18 * 0.0);
    local_118 = ZEXT416((uint)fVar21);
    fVar16 = fVar21 * 0.5 + fVar26;
    fVar17 = -fVar21 * 0.5 + fVar26;
    fVar19 = fVar21 * 0.5 + (float)local_128[0];
    fVar21 = -fVar21 * 0.5 + (float)local_128[0];
    auVar23._4_4_ = -(uint)(fVar17 < 0.0);
    auVar23._0_4_ = -(uint)(fVar16 < 0.0);
    auVar23._8_4_ = -(uint)(fVar19 < 0.0);
    auVar23._12_4_ = -(uint)(fVar21 < 0.0);
    uVar13 = movmskps((int)uVar3,auVar23);
    fVar22 = -0.5;
    if ((uVar13 & 8) == 0) {
      fVar22 = 0.5;
    }
    fVar24 = -0.5;
    if ((uVar13 & 2) == 0) {
      fVar24 = 0.5;
    }
    fVar25 = -0.5;
    if ((uVar13 & 4) == 0) {
      fVar25 = 0.5;
    }
    if ((uVar13 & 1) == 0) {
      fVar27 = 0.5;
    }
    uVar13 = (uint)(fVar21 + fVar22);
    uVar3 = (ulong)uVar13;
    uVar4 = (uint)(fVar17 + fVar24);
    iVar5 = (int)(fVar19 + fVar25) - uVar13;
    iVar8 = (int)(fVar27 + fVar16) - uVar4;
    iVar1 = 0;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    uVar6 = uVar4;
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    for (; iVar1 != iVar8; iVar1 = iVar1 + 1) {
      iVar10 = uVar4 + iVar1;
      fVar27 = (((float)iVar10 + 0.5) - fVar26) / (float)local_118._0_4_;
      uVar3 = (ulong)uVar4;
      uVar9 = uVar13;
      iVar11 = iVar5;
      while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
        local_158.super_ConstPixelBufferAccess.m_format.type = (ChannelType)(fVar27 + 0.5);
        local_158.super_ConstPixelBufferAccess.m_format.order =
             (ChannelOrder)
             ((((float)(int)uVar9 + 0.5) - (float)local_128[0]) / (float)local_118._0_4_ + 0.5);
        local_158.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_158.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
        if ((((-1 < (int)uVar9) && ((int)uVar9 < refImage.m_width)) && (-1 < iVar10)) &&
           (iVar10 < refImage.m_height)) {
          tcu::RGBA::RGBA(&local_15c,(Vec4 *)&local_158);
          uVar3 = (ulong)local_15c.m_value;
          *(deUint32 *)
           ((long)refImage.m_pixels.m_ptr + (long)(int)(refImage.m_width * uVar6 + uVar9) * 4) =
               local_15c.m_value;
        }
        uVar9 = uVar9 + 1;
      }
      uVar6 = uVar6 + 1;
    }
  }
  bVar12 = tcu::fuzzyCompare(((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->
                             m_testCtx->m_log,"Result","Image comparison result",&refImage,&resImage
                             ,0.02,COMPARE_LOG_RESULT);
  if (bVar12) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"Result image matches reference",(allocator<char> *)&local_58);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&local_158);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"Image mismatch",(allocator<char> *)&local_58);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_158);
  }
  std::__cxx11::string::~string((string *)&local_158);
  tcu::Surface::~Surface(&refImage);
  tcu::Surface::~Surface(&resImage);
  std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
            (&coords.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>);
  return __return_storage_ptr__;
}

Assistant:

TestStatus BuiltinGlPointCoordCaseInstance::iterate (void)
{
	const UVec2				viewportSize	= getViewportSize();
	const int				width			= viewportSize.x();
	const int				height			= viewportSize.y();
	const float				threshold		= 0.02f;
	const int				numPoints		= 16;
	vector<Vec3>			coords			(numPoints);
	de::Random				rnd				(0x145fa);
	Surface					resImage		(width, height);
	Surface					refImage		(width, height);
	bool					compareOk		= false;

	// Compute coordinates.
	{
		const VkPhysicalDeviceLimits&	limits					= m_context.getDeviceProperties().limits;
		const float						minPointSize			= limits.pointSizeRange[0];
		const float						maxPointSize			= limits.pointSizeRange[1];
		const int						pointSizeDeltaMultiples	= de::max(1, deCeilFloatToInt32((maxPointSize - minPointSize) / limits.pointSizeGranularity));

		TCU_CHECK(minPointSize <= maxPointSize);

		for (vector<Vec3>::iterator coord = coords.begin(); coord != coords.end(); ++coord)
		{
			coord->x() = rnd.getFloat(-0.9f, 0.9f);
			coord->y() = rnd.getFloat(-0.9f, 0.9f);
			coord->z() = de::min(maxPointSize, minPointSize + float(rnd.getInt(0, pointSizeDeltaMultiples)) * limits.pointSizeGranularity);
		}
	}

	setup();
	addAttribute(0u, VK_FORMAT_R32G32B32_SFLOAT, deUint32(sizeof(Vec3)), numPoints, &coords[0]);
	render(numPoints, 0, DE_NULL, VK_PRIMITIVE_TOPOLOGY_POINT_LIST);
	copy(resImage.getAccess(), getResultImage().getAccess());

	// Draw reference
	clear(refImage.getAccess(), m_clearColor);

	for (vector<Vec3>::const_iterator pointIter = coords.begin(); pointIter != coords.end(); ++pointIter)
	{
		const float	centerX	= float(width) *(pointIter->x()*0.5f + 0.5f);
		const float	centerY	= float(height)*(pointIter->y()*0.5f + 0.5f);
		const float	size	= pointIter->z();
		const int	x0		= deRoundFloatToInt32(centerX - size*0.5f);
		const int	y0		= deRoundFloatToInt32(centerY - size*0.5f);
		const int	x1		= deRoundFloatToInt32(centerX + size*0.5f);
		const int	y1		= deRoundFloatToInt32(centerY + size*0.5f);
		const int	w		= x1-x0;
		const int	h		= y1-y0;

		for (int yo = 0; yo < h; yo++)
		{
			for (int xo = 0; xo < w; xo++)
			{
				const int		dx		= x0+xo;
				const int		dy		= y0+yo;
				const float		fragX	= float(dx) + 0.5f;
				const float		fragY	= float(dy) + 0.5f;
				const float		s		= 0.5f + (fragX - centerX) / size;
				const float		t		= 0.5f + (fragY - centerY) / size;
				const Vec4		color	(s, t, 0.0f, 1.0f);

				if (de::inBounds(dx, 0, refImage.getWidth()) && de::inBounds(dy, 0, refImage.getHeight()))
					refImage.setPixel(dx, dy, RGBA(color));
			}
		}
	}

	compareOk = fuzzyCompare(m_context.getTestContext().getLog(), "Result", "Image comparison result", refImage, resImage, threshold, COMPARE_LOG_RESULT);

	if (compareOk)
		return TestStatus::pass("Result image matches reference");
	else
		return TestStatus::fail("Image mismatch");
}